

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Rex2Gia(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  uint fOrder;
  char *pcVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fOrder = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"avh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x61) {
      Abc_Print(-2,"usage: &rex2gia [-avh] [string]\n");
      Abc_Print(-2,"\t         converts a regular expression into a sequential AIG\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fOrder == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle ordering input symbols alphabetically [default = %s]\n",pcVar2
               );
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tstring : representation of a regular expression\n");
      Abc_Print(-2,
                "\t         Special symbols: parentheses \'(\' and \')\', Kleene closure \'*\', union \'|\'\n"
               );
      Abc_Print(-2,"\t         All other characters are treated as symbols of the input alphabet.\n"
               );
      Abc_Print(-2,"\t         For example, ((A*B|AC)D) is defined over the alphabet {A, B, C, D}\n"
               );
      Abc_Print(-2,
                "\t         and generates the following language: {BD, ABD, AABD, AAABD, ..., ACD}\n"
               );
      Abc_Print(-2,
                "\t         A known limitation:  For the command to work correctly, each two-input union\n"
               );
      pcVar2 = 
      "\t         should have a dedicated pair of parentheses: ((A|B)|C) rather than (A|B|C)\n";
      iVar1 = -2;
LAB_0026ffdb:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fOrder = fOrder ^ 1;
  }
  if (argc - globalUtilOptind == 1) {
    pNew = Gia_ManRex2Gia(argv[globalUtilOptind],fOrder,fVerbose);
    if (pNew == (Gia_Man_t *)0x0) {
      return 0;
    }
    Abc_FrameUpdateGia(pAbc,pNew);
    return 0;
  }
  pcVar2 = "No regular expression is entered on the command line.\n";
  iVar1 = -1;
  goto LAB_0026ffdb;
}

Assistant:

int Abc_CommandAbc9Rex2Gia( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManRex2Gia( char * pStr, int fOrder, int fVerbose );
    Gia_Man_t * pGia = NULL;
    char * pStr = NULL;
    char ** pArgvNew;
    int nArgcNew;
    int c, fOrder = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "avh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fOrder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "No regular expression is entered on the command line.\n" );
        return 1;
    }
    pStr = pArgvNew[0];
    pGia = Gia_ManRex2Gia( pStr, fOrder, fVerbose );
    if ( pGia )
        Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &rex2gia [-avh] [string]\n" );
    Abc_Print( -2, "\t         converts a regular expression into a sequential AIG\n" );
    Abc_Print( -2, "\t-a     : toggle ordering input symbols alphabetically [default = %s]\n", fOrder? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tstring : representation of a regular expression\n");
    Abc_Print( -2, "\t         Special symbols: parentheses \'(\' and \')\', Kleene closure \'*\', union \'|'\n");
    Abc_Print( -2, "\t         All other characters are treated as symbols of the input alphabet.\n");
    Abc_Print( -2, "\t         For example, ((A*B|AC)D) is defined over the alphabet {A, B, C, D}\n");
    Abc_Print( -2, "\t         and generates the following language: {BD, ABD, AABD, AAABD, ..., ACD}\n");
    Abc_Print( -2, "\t         A known limitation:  For the command to work correctly, each two-input union\n");
    Abc_Print( -2, "\t         should have a dedicated pair of parentheses: ((A|B)|C) rather than (A|B|C)\n");
    return 1;
}